

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputlag.c
# Opt level: O0

void sample_input(GLFWwindow *window)

{
  double local_28;
  double y;
  double x;
  GLFWwindow *pGStack_10;
  float a;
  GLFWwindow *window_local;
  
  x._4_4_ = 0.25;
  if (cursor_method == NK_DO_NOT_STOP_ON_NEW_LINE) {
    pGStack_10 = window;
    glfwGetCursorPos(window,&y,&local_28);
    cursor_new.x = (float)y;
    cursor_new.y = (float)local_28;
  }
  cursor_vel.x = (cursor_new.x - cursor_pos.x) * x._4_4_ + cursor_vel.x * (1.0 - x._4_4_);
  cursor_vel.y = (cursor_new.y - cursor_pos.y) * x._4_4_ + cursor_vel.y * (1.0 - x._4_4_);
  cursor_pos.y = cursor_new.y;
  cursor_pos.x = cursor_new.x;
  return;
}

Assistant:

void sample_input(GLFWwindow* window)
{
    float a = .25; // exponential smoothing factor

    if (cursor_method == cursor_sync_query) {
        double x, y;
        glfwGetCursorPos(window, &x, &y);
        cursor_new.x = (float) x;
        cursor_new.y = (float) y;
    }

    cursor_vel.x = (cursor_new.x - cursor_pos.x) * a + cursor_vel.x * (1 - a);
    cursor_vel.y = (cursor_new.y - cursor_pos.y) * a + cursor_vel.y * (1 - a);
    cursor_pos = cursor_new;
}